

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdist.c
# Opt level: O3

double gammapdf(double x,double k,double th)

{
  char *__format;
  double dVar1;
  double dVar2;
  double __x;
  
  dVar1 = 0.0;
  if ((k <= 0.0) || (th <= 0.0)) {
    __format = "Gamma Distribution parameters must be positive and real.";
LAB_001472fb:
    printf(__format);
    exit(1);
  }
  __x = x / th;
  if (__x <= 0.0) {
    if (0.0 <= __x) {
      if ((((k != 1.0) || (NAN(k))) || (__x != 0.0)) || (NAN(__x))) {
        __format = "The Output is Complex and cannot be determined";
        goto LAB_001472fb;
      }
      dVar1 = 1.0 / th;
    }
  }
  else {
    dVar1 = log(__x);
    dVar2 = gamma_log(k);
    dVar1 = exp((dVar1 * (k + -1.0) - __x) - dVar2);
    dVar1 = dVar1 / th;
  }
  return dVar1;
}

Assistant:

double gammapdf(double x, double k, double th) {
	double oup,t;
	/*
	 * Gamma pdf = x ^ (k-1) * exp( - k/th) / (gamma(k) * theta ^k)
	 * Define t = x /th
	 * pdf = exp ((k-1) *log(t) - t - gamma_log(k)) /th
	 */ 
	
	if (k <= 0. || th <= 0.) {
		printf("Gamma Distribution parameters must be positive and real.");
		exit(1);
	}
	
	t = x / th;
	
	if (t > 0.) {
		oup = exp ((k-1) *log(t) - t - gamma_log(k)) /th;
	} else if (t < 0.) {
		oup = 0.0;
	} else if (t == 0.0 && k == 1) {
		oup = 1.0 / th;
	} else {
		printf("The Output is Complex and cannot be determined");
		exit(1);
	}
	
	return oup;
}